

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O1

void __thiscall icu_63::BMPSet::initBits(BMPSet *this)

{
  uint *puVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uint start;
  uint uVar5;
  int32_t iVar6;
  uint uVar7;
  
  iVar2 = 0;
  do {
    iVar4 = iVar2 + 1;
    iVar6 = 0x110000;
    if (iVar4 < this->listLength) {
      lVar3 = (long)iVar4;
      iVar4 = iVar2 + 2;
      iVar6 = this->list[lVar3];
    }
    uVar7 = this->list[iVar2];
    if (0xff < (int)uVar7) break;
    iVar2 = uVar7 + 1;
    if ((int)(uVar7 + 1) < iVar6) {
      iVar2 = iVar6;
    }
    uVar5 = ~uVar7 + iVar2;
    if (0xff - uVar7 <= ~uVar7 + iVar2) {
      uVar5 = 0xff - uVar7;
    }
    memset(this->latin1Contains + (int)uVar7,1,(ulong)uVar5 + 1);
    iVar2 = iVar4;
  } while (iVar6 < 0x101);
  iVar2 = 0;
  do {
    iVar4 = iVar2;
    iVar2 = iVar4 + 1;
    uVar7 = 0x110000;
    if (iVar2 < this->listLength) {
      lVar3 = (long)iVar2;
      iVar2 = iVar4 + 2;
      uVar7 = this->list[lVar3];
    }
  } while ((int)uVar7 < 0x81);
  uVar5 = this->list[iVar4];
  start = 0x80;
  if (0x80 < (int)uVar5) {
    start = uVar5;
  }
  if ((int)uVar5 < 0x800) {
    iVar4 = iVar2;
    do {
      uVar5 = 0x800;
      if ((int)uVar7 < 0x800) {
        uVar5 = uVar7;
      }
      set32x64Bits(this->table7FF,start,uVar5);
      if (0x800 < (int)uVar7) {
        start = 0x800;
        iVar2 = iVar4;
        break;
      }
      iVar2 = iVar4 + 1;
      uVar7 = 0x110000;
      if (iVar2 < this->listLength) {
        lVar3 = (long)iVar2;
        iVar2 = iVar4 + 2;
        uVar7 = this->list[lVar3];
      }
      start = this->list[iVar4];
      iVar4 = iVar2;
    } while ((int)start < 0x800);
  }
  if (start < 0x10000) {
    uVar5 = 0x800;
    do {
      if (0xffff < (int)uVar7) {
        uVar7 = 0x10000;
      }
      if ((int)start <= (int)uVar5) {
        start = uVar5;
      }
      if ((int)start < (int)uVar7) {
        if ((start & 0x3f) != 0) {
          puVar1 = (uint *)((long)this->bmpBlockBits + (ulong)(start >> 4 & 0xfc));
          *puVar1 = *puVar1 | 0x10001 << ((byte)(start >> 0xc) & 0x1f);
          uVar5 = (start & 0xffffffc0) + 0x40;
          start = uVar5;
        }
        if ((int)start < (int)uVar7) {
          if ((int)start < (int)(uVar7 & 0xffffffc0)) {
            set32x64Bits(this->bmpBlockBits,(int)start >> 6,(int)uVar7 >> 6);
          }
          if ((uVar7 & 0x3f) != 0) {
            puVar1 = (uint *)((long)this->bmpBlockBits + (ulong)(uVar7 >> 4 & 0xfc));
            *puVar1 = *puVar1 | 0x10001 << ((byte)(uVar7 >> 0xc) & 0x1f);
            uVar5 = (uVar7 & 0xffffffc0) + 0x40;
            uVar7 = uVar5;
          }
        }
      }
      if (uVar7 == 0x10000) {
        return;
      }
      iVar4 = iVar2 + 1;
      uVar7 = 0x110000;
      if (iVar4 < this->listLength) {
        lVar3 = (long)iVar4;
        iVar4 = iVar2 + 2;
        uVar7 = this->list[lVar3];
      }
      start = this->list[iVar2];
      iVar2 = iVar4;
    } while ((int)start < 0x10000);
  }
  return;
}

Assistant:

void BMPSet::initBits() {
    UChar32 start, limit;
    int32_t listIndex=0;

    // Set latin1Contains[].
    do {
        start=list[listIndex++];
        if(listIndex<listLength) {
            limit=list[listIndex++];
        } else {
            limit=0x110000;
        }
        if(start>=0x100) {
            break;
        }
        do {
            latin1Contains[start++]=1;
        } while(start<limit && start<0x100);
    } while(limit<=0x100);

    // Find the first range overlapping with (or after) 80..FF again,
    // to include them in table7FF as well.
    for(listIndex=0;;) {
        start=list[listIndex++];
        if(listIndex<listLength) {
            limit=list[listIndex++];
        } else {
            limit=0x110000;
        }
        if(limit>0x80) {
            if(start<0x80) {
                start=0x80;
            }
            break;
        }
    }

    // Set table7FF[].
    while(start<0x800) {
        set32x64Bits(table7FF, start, limit<=0x800 ? limit : 0x800);
        if(limit>0x800) {
            start=0x800;
            break;
        }

        start=list[listIndex++];
        if(listIndex<listLength) {
            limit=list[listIndex++];
        } else {
            limit=0x110000;
        }
    }

    // Set bmpBlockBits[].
    int32_t minStart=0x800;
    while(start<0x10000) {
        if(limit>0x10000) {
            limit=0x10000;
        }

        if(start<minStart) {
            start=minStart;
        }
        if(start<limit) {  // Else: Another range entirely in a known mixed-value block.
            if(start&0x3f) {
                // Mixed-value block of 64 code points.
                start>>=6;
                bmpBlockBits[start&0x3f]|=0x10001<<(start>>6);
                start=(start+1)<<6;  // Round up to the next block boundary.
                minStart=start;      // Ignore further ranges in this block.
            }
            if(start<limit) {
                if(start<(limit&~0x3f)) {
                    // Multiple all-ones blocks of 64 code points each.
                    set32x64Bits(bmpBlockBits, start>>6, limit>>6);
                }

                if(limit&0x3f) {
                    // Mixed-value block of 64 code points.
                    limit>>=6;
                    bmpBlockBits[limit&0x3f]|=0x10001<<(limit>>6);
                    limit=(limit+1)<<6;  // Round up to the next block boundary.
                    minStart=limit;      // Ignore further ranges in this block.
                }
            }
        }

        if(limit==0x10000) {
            break;
        }

        start=list[listIndex++];
        if(listIndex<listLength) {
            limit=list[listIndex++];
        } else {
            limit=0x110000;
        }
    }
}